

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigSimMv.c
# Opt level: O3

void Saig_MvSimulateFrame(Saig_MvMan_t *p,int fFirst,int fVerbose)

{
  undefined4 uVar1;
  undefined4 uVar3;
  uint *puVar2;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  Saig_MvAnd_t *pSVar8;
  uchar *puVar9;
  long lVar10;
  Vec_Ptr_t *pVVar11;
  uint uVar12;
  uint uVar13;
  Saig_MvObj_t *pSVar14;
  Saig_MvAnd_t *pSVar15;
  size_t __size;
  
  pSVar14 = p->pAigOld;
  do {
    uVar5 = *(uint *)&pSVar14->field_0x8 & 7;
    switch(uVar5) {
    case 0:
      goto switchD_006c4836_caseD_0;
    case 1:
      break;
    case 2:
      if (pSVar14->iFan1 == 0) {
        if (fFirst == 0) {
          uVar5 = 0xfffffff2;
        }
        else {
          iVar7 = p->nObjs;
          pSVar8 = p->pAigNew;
          if (iVar7 == p->nObjsAlloc) {
            lVar10 = (long)iVar7;
            if (pSVar8 == (Saig_MvAnd_t *)0x0) {
              pSVar8 = (Saig_MvAnd_t *)malloc(lVar10 * 0x18);
            }
            else {
              pSVar8 = (Saig_MvAnd_t *)realloc(pSVar8,lVar10 * 0x18);
              lVar10 = (long)p->nObjsAlloc;
            }
            __size = lVar10 * 2;
            p->pAigNew = pSVar8;
            if (p->pLevels == (uchar *)0x0) {
              puVar9 = (uchar *)malloc(__size);
            }
            else {
              puVar9 = (uchar *)realloc(p->pLevels,__size);
              __size = (size_t)(uint)(p->nObjsAlloc * 2);
              pSVar8 = p->pAigNew;
            }
            p->pLevels = puVar9;
            p->nObjsAlloc = (int)__size;
            iVar7 = p->nObjs;
          }
          else {
            puVar9 = p->pLevels;
          }
          pSVar8[iVar7].iFan0 = 0;
          pSVar8[iVar7].iFan1 = 0;
          pSVar8[iVar7].iNext = 0;
          puVar9[iVar7] = '\0';
          uVar1 = p->nObjs;
          uVar3 = p->nPis;
          p->nObjs = uVar1 + 1;
          p->nPis = uVar3 + 1;
          uVar5 = *(uint *)&pSVar14->field_0x8 & 7 | uVar1 << 4;
        }
        break;
      }
      goto switchD_006c4836_caseD_0;
    case 3:
      uVar12 = *(uint *)&p->pAigOld[pSVar14->iFan0 >> 1].field_0x8 >> 3;
      uVar5 = (pSVar14->iFan0 & 1U ^ uVar12) * 8 + 3;
      if (uVar12 == 0x1ffffffe) {
        uVar5 = 0xfffffff3;
      }
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/saig/saigSimMv.c"
                    ,0x1d0,"void Saig_MvSimulateFrame(Saig_MvMan_t *, int, int)");
    case 5:
      uVar12 = *(uint *)&p->pAigOld[pSVar14->iFan0 >> 1].field_0x8 >> 3;
      uVar5 = pSVar14->iFan0 & 1U ^ uVar12;
      if (uVar12 == 0x1ffffffe) {
        uVar5 = 0x1ffffffe;
      }
      uVar6 = *(uint *)&p->pAigOld[pSVar14->iFan1 >> 1].field_0x8 >> 3;
      uVar12 = pSVar14->iFan1 & 1U ^ uVar6;
      if (uVar6 == 0x1ffffffe) {
        uVar12 = 0x1ffffffe;
      }
      uVar6 = uVar5;
      if ((uVar5 != uVar12) && (uVar6 = 1, (uVar12 ^ uVar5) != 1)) {
        if (uVar5 < 2) {
          uVar6 = uVar12;
          if (uVar5 != 0) {
            uVar6 = 1;
          }
        }
        else if (uVar12 < 2) {
          uVar6 = uVar5;
          if (uVar12 != 0) {
            uVar6 = 1;
          }
        }
        else {
          uVar6 = 0x1ffffffe;
          if ((uVar12 != 0x1ffffffe && uVar5 != 0x1ffffffe) && fFirst != 0) {
            uVar6 = uVar12;
            if (uVar5 >= uVar12 && uVar5 != uVar12) {
              uVar6 = uVar5;
            }
            if (uVar5 < uVar12) {
              uVar12 = uVar5;
            }
            if (uVar6 <= uVar12) {
              __assert_fail("iFan0 < iFan1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/saig/saigSimMv.c"
                            ,0x11d,"int Saig_MvHash(int, int, int)");
            }
            pSVar8 = p->pAigNew;
            uVar5 = 0;
            if ((uVar12 & 1) != 0) {
              uVar5 = 0x38f;
            }
            uVar13 = 0;
            if ((uVar6 & 1) != 0) {
              uVar13 = 0x161;
            }
            uVar4 = (ulong)(uVar5 ^ (uVar12 >> 1) * 0x1f01 ^ (uVar6 >> 1) * 0xb9b ^ uVar13) %
                    (ulong)(uint)p->nTNodesSize;
            iVar7 = p->pTNodes[uVar4];
            if (iVar7 == 0) {
              pSVar15 = (Saig_MvAnd_t *)(p->pTNodes + uVar4);
            }
            else {
              do {
                pSVar15 = pSVar8 + iVar7;
                if ((pSVar15->iFan0 == uVar12) && (pSVar15->iFan1 == uVar6)) goto LAB_006c4b5b;
                iVar7 = pSVar15->iNext;
              } while (iVar7 != 0);
              pSVar15 = (Saig_MvAnd_t *)&pSVar15->iNext;
            }
            if ((pSVar15 < pSVar8) || (pSVar8 + p->nObjsAlloc <= pSVar15)) {
              iVar7 = Saig_MvCreateObj(p,uVar12,uVar6);
              pSVar15->iFan0 = iVar7;
LAB_006c4b5b:
              uVar6 = iVar7 * 2;
            }
            else {
              iVar7 = Saig_MvCreateObj(p,uVar12,uVar6);
              (&p->pAigNew->iFan0)[(int)((ulong)((long)pSVar15 - (long)pSVar8) >> 2)] = iVar7;
              uVar6 = iVar7 * 2;
            }
          }
        }
      }
      uVar5 = (*(uint *)&pSVar14->field_0x8 & 7) + uVar6 * 8;
      break;
    case 7:
      pVVar11 = p->vFlops;
      if (0 < pVVar11->nSize) {
        lVar10 = 0;
        do {
          puVar2 = (uint *)pVVar11->pArray[lVar10];
          uVar5 = *(uint *)&p->pAigOld[(int)*puVar2 >> 1].field_0x8 >> 3;
          uVar12 = 0xfffffff0;
          if (uVar5 != 0x1ffffffe) {
            uVar12 = (uVar5 ^ *puVar2 & 1) << 3;
          }
          puVar2[2] = puVar2[2] & 7 | uVar12;
          lVar10 = lVar10 + 1;
          pVVar11 = p->vFlops;
        } while (lVar10 < pVVar11->nSize);
      }
      return;
    }
    *(uint *)&pSVar14->field_0x8 = uVar5;
switchD_006c4836_caseD_0:
    pSVar14 = pSVar14 + 1;
  } while( true );
}

Assistant:

void Saig_MvSimulateFrame( Saig_MvMan_t * p, int fFirst, int fVerbose )
{
    Saig_MvObj_t * pEntry;
    int i;
    Saig_MvManForEachObj( p->pAigOld, pEntry )
    {
        if ( pEntry->Type == AIG_OBJ_AND )
        {
            pEntry->Value = Saig_MvAnd( p, 
                Saig_MvSimulateValue0(p->pAigOld, pEntry),
                Saig_MvSimulateValue1(p->pAigOld, pEntry), fFirst );
        }
        else if ( pEntry->Type == AIG_OBJ_CO )
            pEntry->Value = Saig_MvSimulateValue0(p->pAigOld, pEntry);
        else if ( pEntry->Type == AIG_OBJ_CI )
        {
            if ( pEntry->iFan1 == 0 ) // true PI
            {
                if ( fFirst )
                    pEntry->Value = Saig_MvVar2Lit( Saig_MvCreateObj( p, 0, 0 ) );
                else
                    pEntry->Value = SAIG_UNDEF_VALUE;
            }
//            else if ( fFirst ) // register output
//                pEntry->Value = Saig_MvConst0();
//            else
//                pEntry->Value = Saig_MvSimulateValue0(p->pAigOld, pEntry);
        }
        else if ( pEntry->Type == AIG_OBJ_CONST1 )
            pEntry->Value = Saig_MvConst1();
        else if ( pEntry->Type != AIG_OBJ_NONE )
            assert( 0 );
    }
    // transfer to registers
    Vec_PtrForEachEntry( Saig_MvObj_t *, p->vFlops, pEntry, i )
        pEntry->Value = Saig_MvSimulateValue0( p->pAigOld, pEntry );
}